

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peimage.cpp
# Opt level: O1

QString * machineTypeToUString(QString *__return_storage_ptr__,UINT16 machineType)

{
  int iVar1;
  undefined6 in_register_00000032;
  storage_type *psVar2;
  QByteArrayView QVar3;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  iVar1 = (int)CONCAT62(in_register_00000032,machineType);
  if (0x1ff < iVar1) {
    if (iVar1 < 0x5064) {
      if (iVar1 == 0x200) {
        psVar2 = (storage_type *)0x4;
        goto LAB_00164f70;
      }
      if (iVar1 == 0xebc) goto LAB_00164f68;
      if (iVar1 != 0x5032) goto switchD_00164dff_caseD_1c1;
    }
    else {
      if (0x8663 < iVar1) {
        if (iVar1 != 0xaa64) {
          if (iVar1 != 0x8664) goto switchD_00164dff_caseD_1c1;
          psVar2 = (storage_type *)0x6;
          goto LAB_00164f70;
        }
        goto LAB_00164f46;
      }
      if (iVar1 != 0x5064) {
        if (iVar1 != 0x5128) goto switchD_00164dff_caseD_1c1;
        psVar2 = (storage_type *)0xe;
        goto LAB_00164f70;
      }
    }
    psVar2 = (storage_type *)0xd;
    goto LAB_00164f70;
  }
  if (0x1ef < iVar1) {
    if (iVar1 != 0x1f0) {
      if (iVar1 != 0x1f1) goto switchD_00164dff_caseD_1c1;
      psVar2 = (storage_type *)0xa;
      goto LAB_00164f70;
    }
LAB_00164f46:
    psVar2 = (storage_type *)0x7;
    goto LAB_00164f70;
  }
  switch(iVar1) {
  case 0x1c0:
    break;
  case 0x1c1:
  case 0x1c3:
  case 0x1c5:
switchD_00164dff_caseD_1c1:
    usprintf(__return_storage_ptr__,"Unknown %04Xh",machineType);
    return __return_storage_ptr__;
  case 0x1c2:
    goto LAB_00164f02;
  case 0x1c4:
    psVar2 = (storage_type *)0x5;
    goto LAB_00164f70;
  case 0x1c6:
LAB_00164f02:
    psVar2 = (storage_type *)0x9;
    goto LAB_00164f70;
  default:
    if (iVar1 != 0x14c) goto switchD_00164dff_caseD_1c1;
  }
LAB_00164f68:
  psVar2 = (storage_type *)0x3;
LAB_00164f70:
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString machineTypeToUString(UINT16 machineType)
{
    switch (machineType) {
        case EFI_IMAGE_FILE_MACHINE_AMD64:       return UString("x86-64");
        case EFI_IMAGE_FILE_MACHINE_ARM:         return UString("ARM");
        case EFI_IMAGE_FILE_MACHINE_ARMNT:       return UString("ARMv7");
        case EFI_IMAGE_FILE_MACHINE_APPLE_ARM:   return UString("Apple ARM");
        case EFI_IMAGE_FILE_MACHINE_AARCH64:     return UString("AArch64");
        case EFI_IMAGE_FILE_MACHINE_EBC:         return UString("EBC");
        case EFI_IMAGE_FILE_MACHINE_I386:        return UString("x86");
        case EFI_IMAGE_FILE_MACHINE_IA64:        return UString("IA64");
        case EFI_IMAGE_FILE_MACHINE_POWERPC:     return UString("PowerPC");
        case EFI_IMAGE_FILE_MACHINE_POWERPCFP:   return UString("PowerPC FP");
        case EFI_IMAGE_FILE_MACHINE_THUMB:       return UString("ARM Thumb");
        case EFI_IMAGE_FILE_MACHINE_RISCV32:     return UString("RISC-V 32-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV64:     return UString("RISC-V 64-bit");
        case EFI_IMAGE_FILE_MACHINE_RISCV128:    return UString("RISC-V 128-bit");
    }
    return usprintf("Unknown %04Xh", machineType);
}